

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.hpp
# Opt level: O0

uint32_t __thiscall spirv_cross::CFG::get_visit_order(CFG *this,uint32_t block)

{
  bool bVar1;
  pointer pvVar2;
  uint32_t *puVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_false> _Stack_28;
  int v;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_false> local_20;
  const_iterator itr;
  uint32_t block_local;
  CFG *this_local;
  
  itr.super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_false>.
  _M_cur._4_4_ = block;
  local_20._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_spirv_cross::CFG::VisitOrder,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>_>
       ::find(&this->visit_order,
              (key_type *)
              ((long)&itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_false>
                      ._M_cur + 4));
  _Stack_28._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<unsigned_int,spirv_cross::CFG::VisitOrder,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::CFG::VisitOrder>>>>
                 (&this->visit_order);
  bVar1 = ::std::__detail::operator!=(&local_20,&stack0xffffffffffffffd8);
  if (!bVar1) {
    __assert_fail("itr != std::end(visit_order)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_cfg.hpp"
                  ,0x46,"uint32_t spirv_cross::CFG::get_visit_order(uint32_t) const");
  }
  pvVar2 = ::std::__detail::
           _Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_false,_false>
                         *)&local_20);
  puVar3 = (uint32_t *)VisitOrder::get(&pvVar2->second);
  if (0 < (int)*puVar3) {
    return *puVar3;
  }
  __assert_fail("v > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_cfg.hpp"
                ,0x48,"uint32_t spirv_cross::CFG::get_visit_order(uint32_t) const");
}

Assistant:

uint32_t get_visit_order(uint32_t block) const
	{
		auto itr = visit_order.find(block);
		assert(itr != std::end(visit_order));
		int v = itr->second.get();
		assert(v > 0);
		return uint32_t(v);
	}